

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_tests.cpp
# Opt level: O3

InteractResult * __thiscall
net_tests::anon_unknown_17::V2TransportTester::Interact
          (InteractResult *__return_storage_ptr__,V2TransportTester *this)

{
  V2Transport *this_00;
  pointer pbVar1;
  FastRandomContext *pFVar2;
  pointer __dest;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  pointer pbVar6;
  uint64_t uVar7;
  pointer puVar8;
  ptrdiff_t _Num;
  size_t __n;
  ulong uVar9;
  _Elt_pointer msg;
  pointer pbVar10;
  long lVar11;
  pointer __src;
  long in_FS_OFFSET;
  bool reject;
  vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_> ret;
  Span<const_unsigned_char> to_send;
  bool local_a9;
  vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_> local_a8;
  CNetMessage local_88;
  InteractResult *local_38;
  
  local_38 = *(InteractResult **)(in_FS_OFFSET + 0x28);
  local_a8.
  super__Vector_base<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.
  super__Vector_base<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.
  super__Vector_base<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = &this->m_transport;
  do {
    pbVar1 = (this->m_to_send).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pbVar10 = (this->m_to_send).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (pbVar1 == pbVar10) {
      bVar3 = false;
    }
    else {
      pbVar10 = pbVar10 + ~(ulong)pbVar1;
      if (pbVar10 == (pointer)0x0) {
        uVar5 = 0x40;
      }
      else {
        lVar11 = 0x3f;
        if (pbVar10 != (pointer)0x0) {
          for (; (ulong)pbVar10 >> lVar11 == 0; lVar11 = lVar11 + -1) {
          }
        }
        uVar5 = (uint)lVar11 ^ 0x3f;
      }
      pFVar2 = this->m_rng;
      do {
        pbVar6 = (pointer)RandomMixin<FastRandomContext>::randbits
                                    (&pFVar2->super_RandomMixin<FastRandomContext>,0x40 - uVar5);
      } while (pbVar10 < pbVar6);
      local_88.m_recv.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
      _M_impl.super__Vector_impl_data._M_start = pbVar1;
      local_88.m_recv.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
      _M_impl.super__Vector_impl_data._M_finish = pbVar6 + 1;
      bVar3 = V2Transport::ReceivedBytes(this_00,(Span<const_unsigned_char> *)&local_88);
      if (!bVar3) {
        (__return_storage_ptr__->
        super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
        )._M_payload.
        super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
        ._M_engaged = false;
        goto LAB_004d0041;
      }
      lVar11 = (long)(pbVar6 + 1) -
               (long)local_88.m_recv.vch.
                     super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
                     super__Vector_impl_data._M_finish;
      if (lVar11 == 0) {
        bVar3 = false;
      }
      else {
        __dest = (this->m_to_send).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        __src = __dest + lVar11;
        __n = (long)(this->m_to_send).
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)__src;
        puVar8 = __src;
        if (__n != 0) {
          memmove(__dest,__src,__n);
          puVar8 = (this->m_to_send).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        }
        bVar3 = true;
        if (puVar8 != __dest + ((long)puVar8 - (long)__src)) {
          (this->m_to_send).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_finish = __dest + ((long)puVar8 - (long)__src);
        }
      }
    }
    bVar4 = V2Transport::ReceivedMessageComplete(this_00);
    if ((bVar4) &&
       ((!bVar3 ||
        (uVar7 = RandomMixin<FastRandomContext>::randbits<1>
                           (&this->m_rng->super_RandomMixin<FastRandomContext>), uVar7 != 0)))) {
      local_a9 = false;
      V2Transport::GetReceivedMessage(&local_88,this_00,(microseconds)0x0,&local_a9);
      if (local_a9 == true) {
        if (local_a8.
            super__Vector_base<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_a8.
            super__Vector_base<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<std::optional<CNetMessage>,std::allocator<std::optional<CNetMessage>>>::
          _M_realloc_insert<std::nullopt_t_const&>
                    ((vector<std::optional<CNetMessage>,std::allocator<std::optional<CNetMessage>>>
                      *)&local_a8,
                     (iterator)
                     local_a8.
                     super__Vector_base<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,(nullopt_t *)&std::nullopt);
        }
        else {
          ((local_a8.
            super__Vector_base<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>
            ._M_impl.super__Vector_impl_data._M_finish)->
          super__Optional_base<CNetMessage,_false,_false>)._M_payload.
          super__Optional_payload<CNetMessage,_true,_false,_false>.
          super__Optional_payload_base<CNetMessage>._M_engaged = false;
          local_a8.
          super__Vector_base<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_a8.
               super__Vector_base<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
      }
      else {
        std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>::
        emplace_back<CNetMessage>(&local_a8,&local_88);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88.m_type._M_dataplus._M_p != &local_88.m_type.field_2) {
        operator_delete(local_88.m_type._M_dataplus._M_p,
                        local_88.m_type.field_2._M_allocated_capacity + 1);
      }
      std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
                ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&local_88);
      bVar3 = true;
    }
    msg = (this->m_msg_to_send).
          super__Deque_base<CSerializedNetMsg,_std::allocator<CSerializedNetMsg>_>._M_impl.
          super__Deque_impl_data._M_start._M_cur;
    if ((this->m_msg_to_send).
        super__Deque_base<CSerializedNetMsg,_std::allocator<CSerializedNetMsg>_>._M_impl.
        super__Deque_impl_data._M_finish._M_cur != msg) {
      if (bVar3) {
        uVar7 = RandomMixin<FastRandomContext>::randbits<1>
                          (&this->m_rng->super_RandomMixin<FastRandomContext>);
        if (uVar7 == 0) goto LAB_004cff56;
        msg = (this->m_msg_to_send).
              super__Deque_base<CSerializedNetMsg,_std::allocator<CSerializedNetMsg>_>._M_impl.
              super__Deque_impl_data._M_start._M_cur;
      }
      bVar4 = V2Transport::SetMessageToSend(this_00,msg);
      if (bVar4) {
        std::deque<CSerializedNetMsg,_std::allocator<CSerializedNetMsg>_>::pop_front
                  (&this->m_msg_to_send);
        bVar3 = true;
      }
    }
LAB_004cff56:
    V2Transport::GetBytesToSend_abi_cxx11_
              ((BytesToSend *)&local_88,this_00,
               (this->m_msg_to_send).
               super__Deque_base<CSerializedNetMsg,_std::allocator<CSerializedNetMsg>_>._M_impl.
               super__Deque_impl_data._M_finish._M_cur !=
               (this->m_msg_to_send).
               super__Deque_base<CSerializedNetMsg,_std::allocator<CSerializedNetMsg>_>._M_impl.
               super__Deque_impl_data._M_start._M_cur);
    if (local_88.m_recv.m_read_pos == 0) {
      if (!bVar3) {
        *(pointer *)
         &(__return_storage_ptr__->
          super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
          )._M_payload.
          super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
          ._M_payload._M_value.
          super__Vector_base<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>
          ._M_impl = local_a8.
                     super__Vector_base<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
        *(pointer *)
         ((long)&(__return_storage_ptr__->
                 super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
                 )._M_payload.
                 super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
                 .
                 super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
                 ._M_payload._M_value.
                 super__Vector_base<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>
                 ._M_impl + 8) =
             local_a8.
             super__Vector_base<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        *(pointer *)
         ((long)&(__return_storage_ptr__->
                 super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
                 )._M_payload.
                 super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
                 .
                 super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
                 ._M_payload._M_value.
                 super__Vector_base<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>
                 ._M_impl + 0x10) =
             local_a8.
             super__Vector_base<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_a8.
        super__Vector_base<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_a8.
        super__Vector_base<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_a8.
        super__Vector_base<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (__return_storage_ptr__->
        super__Optional_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_false,_false>
        )._M_payload.
        super__Optional_payload<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>_>
        ._M_engaged = true;
LAB_004d0041:
        std::vector<std::optional<CNetMessage>,_std::allocator<std::optional<CNetMessage>_>_>::
        ~vector(&local_a8);
        if (*(InteractResult **)(in_FS_OFFSET + 0x28) != local_38) {
          __stack_chk_fail();
        }
        return *(InteractResult **)(in_FS_OFFSET + 0x28);
      }
    }
    else if ((!bVar3) ||
            (uVar7 = RandomMixin<FastRandomContext>::randbits<1>
                               (&this->m_rng->super_RandomMixin<FastRandomContext>), uVar7 != 0)) {
      uVar9 = local_88.m_recv.m_read_pos - 1;
      if (uVar9 == 0) {
        uVar5 = 0x40;
      }
      else {
        lVar11 = 0x3f;
        if (uVar9 != 0) {
          for (; uVar9 >> lVar11 == 0; lVar11 = lVar11 + -1) {
          }
        }
        uVar5 = (uint)lVar11 ^ 0x3f;
      }
      pFVar2 = this->m_rng;
      do {
        uVar7 = RandomMixin<FastRandomContext>::randbits
                          (&pFVar2->super_RandomMixin<FastRandomContext>,0x40 - uVar5);
      } while (uVar9 < uVar7);
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      _M_range_insert<unsigned_char_const*>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&this->m_received,
                 (this->m_received).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish,
                 local_88.m_recv.vch.
                 super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage,
                 local_88.m_recv.vch.
                 super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage + uVar7 + 1);
      V2Transport::MarkBytesSent(this_00,uVar7 + 1);
    }
  } while( true );
}

Assistant:

InteractResult Interact()
    {
        std::vector<std::optional<CNetMessage>> ret;
        while (true) {
            bool progress{false};
            // Send bytes from m_to_send to the transport.
            if (!m_to_send.empty()) {
                Span<const uint8_t> to_send = Span{m_to_send}.first(1 + m_rng.randrange(m_to_send.size()));
                size_t old_len = to_send.size();
                if (!m_transport.ReceivedBytes(to_send)) {
                    return std::nullopt; // transport error occurred
                }
                if (old_len != to_send.size()) {
                    progress = true;
                    m_to_send.erase(m_to_send.begin(), m_to_send.begin() + (old_len - to_send.size()));
                }
            }
            // Retrieve messages received by the transport.
            if (m_transport.ReceivedMessageComplete() && (!progress || m_rng.randbool())) {
                bool reject{false};
                auto msg = m_transport.GetReceivedMessage({}, reject);
                if (reject) {
                    ret.emplace_back(std::nullopt);
                } else {
                    ret.emplace_back(std::move(msg));
                }
                progress = true;
            }
            // Enqueue a message to be sent by the transport to us.
            if (!m_msg_to_send.empty() && (!progress || m_rng.randbool())) {
                if (m_transport.SetMessageToSend(m_msg_to_send.front())) {
                    m_msg_to_send.pop_front();
                    progress = true;
                }
            }
            // Receive bytes from the transport.
            const auto& [recv_bytes, _more, _msg_type] = m_transport.GetBytesToSend(!m_msg_to_send.empty());
            if (!recv_bytes.empty() && (!progress || m_rng.randbool())) {
                size_t to_receive = 1 + m_rng.randrange(recv_bytes.size());
                m_received.insert(m_received.end(), recv_bytes.begin(), recv_bytes.begin() + to_receive);
                progress = true;
                m_transport.MarkBytesSent(to_receive);
            }
            if (!progress) break;
        }
        return ret;
    }